

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<QTzTransition>::reallocate
          (QPodArrayOps<QTzTransition> *this,qsizetype alloc,AllocationOption option)

{
  pair<QTypedArrayData<QTzTransition>_*,_QTzTransition_*> pVar1;
  
  pVar1 = QTypedArrayData<QTzTransition>::reallocateUnaligned
                    ((this->super_QArrayDataPointer<QTzTransition>).d,
                     (this->super_QArrayDataPointer<QTzTransition>).ptr,alloc,option);
  if (pVar1.second != (QTzTransition *)0x0) {
    (this->super_QArrayDataPointer<QTzTransition>).d = pVar1.first;
    (this->super_QArrayDataPointer<QTzTransition>).ptr = pVar1.second;
    return;
  }
  qBadAlloc();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }